

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O0

void helper_gvec_fcmlah_arm(void *vd,void *vn,void *vm,void *vfpst,uint32_t desc)

{
  ushort uVar1;
  float16 fVar2;
  float16 fVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  ulong opr_sz_00;
  ulong uVar6;
  uintptr_t max_sz;
  float16 e3;
  float16 e4;
  float16 e1;
  float16 e2;
  uintptr_t i;
  uint32_t neg_real;
  uint32_t neg_imag;
  intptr_t flip;
  float_status *fpst;
  float16 *m;
  float16 *n;
  float16 *d;
  uintptr_t opr_sz;
  uint32_t desc_local;
  void *vfpst_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  opr_sz_00 = simd_oprsz(desc);
  uVar4 = extract32(desc,10,1);
  uVar6 = (ulong)uVar4;
  uVar5 = extract32(desc,0xb,1);
  for (_e3 = 0; _e3 < opr_sz_00 >> 1; _e3 = _e3 + 2) {
    fVar3 = *(float16 *)((long)vn + (_e3 + uVar6) * 2);
    uVar1 = *(ushort *)((long)vm + ((_e3 + 1) - uVar6) * 2);
    fVar2 = float16_muladd_arm(fVar3,*(ushort *)((long)vm + (_e3 + uVar6) * 2) ^
                                     (ushort)((uVar4 ^ uVar5) << 0xf),
                               *(float16 *)((long)vd + _e3 * 2),0,(float_status *)vfpst);
    *(float16 *)((long)vd + _e3 * 2) = fVar2;
    fVar3 = float16_muladd_arm(fVar3,uVar1 ^ (ushort)(uVar5 << 0xf),
                               *(float16 *)((long)vd + _e3 * 2 + 2),0,(float_status *)vfpst);
    *(float16 *)((long)vd + _e3 * 2 + 2) = fVar3;
  }
  max_sz = simd_maxsz(desc);
  clear_tail(vd,opr_sz_00,max_sz);
  return;
}

Assistant:

void HELPER(gvec_fcmlah)(void *vd, void *vn, void *vm,
                         void *vfpst, uint32_t desc)
{
    uintptr_t opr_sz = simd_oprsz(desc);
    float16 *d = vd;
    float16 *n = vn;
    float16 *m = vm;
    float_status *fpst = vfpst;
    intptr_t flip = extract32(desc, SIMD_DATA_SHIFT, 1);
    uint32_t neg_imag = extract32(desc, SIMD_DATA_SHIFT + 1, 1);
    uint32_t neg_real = flip ^ neg_imag;
    uintptr_t i;

    /* Shift boolean to the sign bit so we can xor to negate.  */
    neg_real <<= 15;
    neg_imag <<= 15;

    for (i = 0; i < opr_sz / 2; i += 2) {
        float16 e2 = n[H2(i + flip)];
        float16 e1 = m[H2(i + flip)] ^ neg_real;
        float16 e4 = e2;
        float16 e3 = m[H2(i + 1 - flip)] ^ neg_imag;

        d[H2(i)] = float16_muladd(e2, e1, d[H2(i)], 0, fpst);
        d[H2(i + 1)] = float16_muladd(e4, e3, d[H2(i + 1)], 0, fpst);
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}